

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

uint32_t instr_get_size(thanm_instr_t *instr,int32_t version)

{
  list_node_t *plVar1;
  uint32_t uVar2;
  
  uVar2 = (uint)(version != 0) * 4 + 4;
  for (plVar1 = (instr->params).head; plVar1 != (list_node_t *)0x0; plVar1 = plVar1->next) {
    uVar2 = uVar2 + (uint)(*plVar1->data != 0x73) * 2 + 2;
  }
  return uVar2;
}

Assistant:

uint32_t
instr_get_size(
    thanm_instr_t* instr,
    int32_t version
) {
    uint32_t size = version == 0 ? sizeof(anm_instr0_t) : sizeof(anm_instr_t);
    thanm_param_t* param;
    list_for_each(&instr->params, param) {
        switch(param->type) {
            case 's':
                size += sizeof(int16_t);
                break;
            default:
                size += 4;
        }
    }

    return size;
}